

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O0

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  ostream *poVar4;
  undefined1 local_480 [8];
  string warning;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  stringstream local_438 [8];
  stringstream ss;
  ostream local_428 [376];
  long local_2b0;
  ifstream matIStream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string filepath;
  string *err_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *matMap_local;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials_local;
  string *matId_local;
  MaterialFileReader *this_local;
  
  filepath.field_2._8_8_ = err;
  std::__cxx11::string::string((string *)local_58);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->m_mtlBaseDir);
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,matId);
  }
  else {
    std::__cxx11::string::string((string *)&local_98,&this->m_mtlBaseDir);
    std::operator+(&local_78,&local_98,matId);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58)
  ;
  std::ifstream::ifstream(&local_2b0,pcVar3,8);
  bVar2 = std::ios::operator!((ios *)((long)&local_2b0 + *(long *)(local_2b0 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::__cxx11::string::string((string *)local_480);
    LoadMtl(matMap,materials,(istream *)&local_2b0,(string *)local_480);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_480);
    if ((!bVar1) && (filepath.field_2._8_8_ != 0)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 filepath.field_2._8_8_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480);
    }
    this_local._7_1_ = true;
    warning.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_480);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_438);
    poVar4 = std::operator<<(local_428,"WARN: Material file [ ");
    poVar4 = std::operator<<(poVar4,(string *)local_58);
    poVar4 = std::operator<<(poVar4," ] not found.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    if (filepath.field_2._8_8_ != 0) {
      std::__cxx11::stringstream::str();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 filepath.field_2._8_8_,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
    }
    this_local._7_1_ = false;
    warning.field_2._12_4_ = 1;
    std::__cxx11::stringstream::~stringstream(local_438);
  }
  std::ifstream::~ifstream(&local_2b0);
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> *materials,
                                    std::map<std::string, int> *matMap,
                                    std::string *err) {
  std::string filepath;

  if (!m_mtlBaseDir.empty()) {
    filepath = std::string(m_mtlBaseDir) + matId;
  } else {
    filepath = matId;
  }

  std::ifstream matIStream(filepath.c_str());
  if (!matIStream) {
    std::stringstream ss;
    ss << "WARN: Material file [ " << filepath << " ] not found." << std::endl;
    if (err) {
      (*err) += ss.str();
    }
    return false;
  }

  std::string warning;
  LoadMtl(matMap, materials, &matIStream, &warning);

  if (!warning.empty()) {
    if (err) {
      (*err) += warning;
    }
  }

  return true;
}